

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QString,QAnyStringView>
                    (QList<QString> *vector,QAnyStringView *u,qsizetype from)

{
  ulong uVar1;
  QString *pQVar2;
  long lVar3;
  bool bVar4;
  qsizetype qVar5;
  ulong uVar6;
  qsizetype *pqVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_48;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (vector->d).size;
  uVar6 = from;
  if (from < 0) {
    uVar6 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar6 = 0;
    }
  }
  qVar5 = -1;
  if (uVar6 < uVar1) {
    pQVar2 = (vector->d).ptr;
    pqVar7 = &pQVar2[uVar6].d.size;
    lVar9 = uVar1 * 0x18 + uVar6 * -0x18;
    lVar3 = 0x18 - (long)(pQVar2 + uVar6);
    do {
      lVar8 = lVar3;
      if (lVar9 == 0) {
        qVar5 = -1;
        goto LAB_001c17dc;
      }
      local_48 = *(anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(pqVar7 + -1);
      local_40 = *pqVar7 | 0x8000000000000000;
      bVar4 = comparesEqual((QAnyStringView *)&local_48,u);
      pqVar7 = pqVar7 + 3;
      lVar9 = lVar9 + -0x18;
      lVar3 = lVar8 + -0x18;
    } while (!bVar4);
    qVar5 = -((long)&(vector->d).ptr[-1].d.d + lVar8) / 0x18;
  }
LAB_001c17dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar5;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}